

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O3

PropertyQueryFlags __thiscall
Js::ModuleRoot::GetItemQuery
          (ModuleRoot *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  HostObjectBase *pHVar1;
  PropertyQueryFlags PVar2;
  int iVar3;
  RecyclableObject *pRVar4;
  PropertyQueryFlags PVar5;
  
  PVar2 = DynamicObject::GetItemQuery
                    ((DynamicObject *)this,originalInstance,index,value,requestContext);
  PVar5 = Property_Found;
  if (PVar2 != Property_Found) {
    pHVar1 = (this->super_RootObjectBase).hostObject.ptr;
    if ((pHVar1 != (HostObjectBase *)0x0) &&
       (iVar3 = (**(code **)(*(long *)pHVar1 + 0x130))
                          (pHVar1,originalInstance,index,value,requestContext), iVar3 == 1)) {
      return Property_Found;
    }
    pRVar4 = ScriptContext::GetMissingItemResult(requestContext);
    *value = pRVar4;
    PVar5 = Property_NotFound;
  }
  return PVar5;
}

Assistant:

PropertyQueryFlags ModuleRoot::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetItemQuery(originalInstance, index, value, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        if (this->hostObject && this->hostObject->GetItem(originalInstance, index, value, requestContext))
        {
            return PropertyQueryFlags::Property_Found;
        }
        *value = requestContext->GetMissingItemResult();
        return PropertyQueryFlags::Property_NotFound;
    }